

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  int iVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool bVar74;
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  bool bVar81;
  bool bVar82;
  bool bVar83;
  bool bVar84;
  bool bVar85;
  bool bVar86;
  bool bVar87;
  bool bVar88;
  dropt_error dVar89;
  char *pcVar90;
  long lVar91;
  char *pcVar92;
  dropt_char *a;
  dropt_context *context;
  long *plVar93;
  uchar *in_RCX;
  uchar *puVar94;
  byte bVar95;
  size_t in_R8;
  size_t tbslen;
  dropt_help_params helpParams;
  
  pcVar90 = (char *)dropt_strndup("foo bar",3);
  if (pcVar90 == (char *)0x0) {
LAB_0010466f:
    fputs("Insufficient memory.\n",_stderr);
  }
  else {
    iVar2 = strcmp(pcVar90,"foo");
    verify((EVP_PKEY_CTX *)(ulong)(iVar2 == 0),(uchar *)"dropt_strcmp(copy, T(\"foo\")) == 0",0x159,
           in_RCX,in_R8);
    free(pcVar90);
    pcVar90 = (char *)dropt_strndup("foo bar",100);
    if (pcVar90 == (char *)0x0) goto LAB_0010466f;
    iVar3 = strcmp(pcVar90,"foo bar");
    verify((EVP_PKEY_CTX *)(ulong)(iVar3 == 0),(uchar *)"dropt_strcmp(copy, s) == 0",0x165,in_RCX,
           in_R8);
    free(pcVar90);
    pcVar90 = (char *)dropt_strdup("foo bar");
    if (pcVar90 == (char *)0x0) goto LAB_0010466f;
    iVar4 = strcmp(pcVar90,"foo bar");
    verify((EVP_PKEY_CTX *)(ulong)(iVar4 == 0),(uchar *)"dropt_strcmp(copy, s) == 0",0x171,in_RCX,
           in_R8);
    free(pcVar90);
    iVar5 = dropt_strnicmp("foo bar","FOO QUX",4);
    verify((EVP_PKEY_CTX *)(ulong)(iVar5 == 0),(uchar *)"dropt_strnicmp(s, t, 4) == 0",0x175,in_RCX,
           in_R8);
    uVar6 = dropt_strnicmp("foo bar","FOO QUX",5);
    verify((EVP_PKEY_CTX *)(ulong)(uVar6 >> 0x1f),(uchar *)"dropt_strnicmp(s, t, 5) < 0",0x176,
           in_RCX,in_R8);
    iVar7 = dropt_strnicmp("FOO QUX","foo bar",5);
    verify((EVP_PKEY_CTX *)(ulong)(0 < iVar7),(uchar *)"dropt_strnicmp(t, s, 5) > 0",0x177,in_RCX,
           in_R8);
    uVar8 = dropt_stricmp("foo bar","FOO QUX");
    verify((EVP_PKEY_CTX *)(ulong)(uVar8 >> 0x1f),(uchar *)"dropt_stricmp(s, t) < 0",0x179,in_RCX,
           in_R8);
    iVar9 = dropt_stricmp("FOO QUX","foo bar");
    verify((EVP_PKEY_CTX *)(ulong)(0 < iVar9),(uchar *)"dropt_stricmp(t, s) > 0",0x17a,in_RCX,in_R8)
    ;
    iVar10 = dropt_stricmp("foo","FOO");
    verify((EVP_PKEY_CTX *)(ulong)(iVar10 == 0),
           (uchar *)"dropt_stricmp(T(\"foo\"), T(\"FOO\")) == 0",0x17b,in_RCX,in_R8);
    helpParams.indent = 0;
    puVar94 = "foo";
    iVar11 = dropt_snprintf(&helpParams,4,"%s");
    verify((EVP_PKEY_CTX *)(ulong)(iVar11 == 3),
           (uchar *)"dropt_snprintf(buf, ARRAY_LENGTH(buf), T(\"%s\"), T(\"foo\")) == 3",0x182,
           puVar94,in_R8);
    bVar12 = string_equal((dropt_char *)&helpParams,"foo");
    verify((EVP_PKEY_CTX *)(ulong)bVar12,(uchar *)"string_equal(buf, T(\"foo\"))",0x183,puVar94,
           in_R8);
    helpParams._0_8_ = (ulong)helpParams.description_start_column << 0x20;
    pcVar90 = "bar baz";
    iVar13 = dropt_snprintf(&helpParams,4,"%s");
    verify((EVP_PKEY_CTX *)(ulong)(iVar13 == 7),
           (uchar *)"dropt_snprintf(buf, ARRAY_LENGTH(buf), T(\"%s\"), T(\"bar baz\")) == 7",0x186,
           (uchar *)pcVar90,in_R8);
    bVar14 = string_equal((dropt_char *)&helpParams,"bar");
    verify((EVP_PKEY_CTX *)(ulong)bVar14,(uchar *)"string_equal(buf, T(\"bar\"))",0x187,
           (uchar *)pcVar90,in_R8);
    lVar91 = dropt_ssopen();
    if (lVar91 == 0) goto LAB_0010466f;
    pcVar92 = (char *)dropt_ssgetstring(lVar91);
    cVar1 = *pcVar92;
    verify((EVP_PKEY_CTX *)(ulong)(cVar1 == '\0'),(uchar *)"dropt_ssgetstring(ss)[0] == T(\'\\0\')",
           0x196,(uchar *)pcVar90,in_R8);
    puVar94 = (uchar *)0xcafebabe;
    tbslen = 0x7a69;
    iVar15 = dropt_ssprintf(lVar91,"hello %s %X %d%c","world",0xcafebabe,0x7a69,0x21);
    verify((EVP_PKEY_CTX *)(ulong)(iVar15 == 0x1b),
           (uchar *)
           "dropt_ssprintf(ss, T(\"hello %s %X %d%c\"), T(\"world\"), 0xCAFEBABE, 31337, T(\'!\')) == 27"
           ,0x199,puVar94,tbslen);
    dropt_ssprintf(lVar91,"%c",10);
    dropt_ssprintf(lVar91,"Lorem ipsum dolor sit amet, consectetuer adipiscing elit. ");
    dropt_ssprintf(lVar91,"Aenean quis mauris. In augue. ");
    dropt_ssprintf(lVar91,
                   "Suspendisse orci felis, tristique eget, lacinia rhoncus, interdum at, lorem.");
    dropt_ssprintf(lVar91,"Aliquam gravida dui nec erat. Integer pede. Aliquam erat volutpat.");
    dropt_ssprintf(lVar91,"In eu nisl. Curabitur non tellus id arcu feugiat porta orci aliquam.");
    iVar16 = dropt_ssprintf(lVar91,"%c",0);
    verify((EVP_PKEY_CTX *)(ulong)(iVar16 == 1),
           (uchar *)"dropt_ssprintf(ss, T(\"%c\"), T(\'\\0\')) == 1",0x1a6,puVar94,tbslen);
    dropt_ssprintf(lVar91,"This is junk data.");
    a = (dropt_char *)dropt_ssfinalize(lVar91);
    bVar17 = string_equal(a,
                          "hello world CAFEBABE 31337!\nLorem ipsum dolor sit amet, consectetuer adipiscing elit. Aenean quis mauris. In augue. Suspendisse orci felis, tristique eget, lacinia rhoncus, interdum at, lorem.Aliquam gravida dui nec erat. Integer pede. Aliquam erat volutpat.In eu nisl. Curabitur non tellus id arcu feugiat porta orci aliquam."
                         );
    verify((EVP_PKEY_CTX *)(ulong)bVar17,(uchar *)"string_equal(s, expectedString)",0x1b1,puVar94,
           tbslen);
    free(a);
    if (((uint)(iVar15 == 0x1b && iVar16 == 1) &
         (iVar10 == 0 && iVar11 == 3) & bVar12 & (uint)(iVar13 == 7) & bVar14 &
         uVar6 >> 0x1f & (uint)(0 < iVar7) & uVar8 >> 0x1f & (uint)(0 < iVar9) &
         (uint)((iVar4 == 0 && iVar5 == 0) && (iVar3 == 0 && iVar2 == 0)) & (uint)(cVar1 == '\0') &
        bVar17) != false) {
      context = (dropt_context *)dropt_new_context(options);
      if (context != (dropt_context *)0x0) {
        bVar12 = test_dropt_handle_bool(context,(dropt_char *)0x0,0,'\x01','\0',0x1fb);
        bVar14 = test_dropt_handle_bool(context,(dropt_char *)0x0,0,'\x01','\0',0x1fc);
        bVar17 = test_dropt_handle_bool(context,"",6,'\0','\0',0x1fd);
        bVar18 = test_dropt_handle_bool(context," ",6,'\0','\0',0x1fe);
        bVar19 = test_dropt_handle_bool(context,"1",0,'\x01','\0',0x1ff);
        bVar20 = test_dropt_handle_bool(context,"0",0,'\0','\0',0x200);
        bVar21 = test_dropt_handle_bool(context,"2",6,'\0','\0',0x201);
        bVar22 = test_dropt_handle_bool(context,"-1",6,'\0','\0',0x202);
        bVar23 = test_dropt_handle_bool(context,"01",0,'\x01','\0',0x203);
        bVar24 = test_dropt_handle_bool(context,"11",6,'\0','\0',0x204);
        bVar25 = test_dropt_handle_bool(context,"a",6,'\0','\0',0x205);
        bVar26 = test_dropt_handle_bool(context,"a",6,'\x01','\x01',0x206);
        bVar27 = test_dropt_handle_bool(context,"true",6,'\0','\0',0x207);
        bVar28 = test_dropt_handle_bool(context,"false",6,'\0','\0',0x208);
        bVar29 = test_dropt_handle_bool(context,"3000000000",6,'\0','\0',0x209);
        bVar30 = test_dropt_handle_bool(context,"-3000000000",6,'\0','\0',0x20a);
        bVar31 = test_dropt_handle_bool(context,"5000000000",6,'\0','\0',0x20b);
        bVar32 = test_dropt_handle_verbose_bool(context,(dropt_char *)0x0,0,'\x01','\0',0x20d);
        bVar33 = test_dropt_handle_verbose_bool(context,"",6,'\0','\0',0x20e);
        bVar34 = test_dropt_handle_verbose_bool(context," ",6,'\0','\0',0x20f);
        bVar35 = test_dropt_handle_verbose_bool(context,"1",0,'\x01','\0',0x210);
        bVar36 = test_dropt_handle_verbose_bool(context,"0",0,'\0','\0',0x211);
        bVar37 = test_dropt_handle_verbose_bool(context,"2",6,'\0','\0',0x212);
        bVar38 = test_dropt_handle_verbose_bool(context,"-1",6,'\0','\0',0x213);
        bVar39 = test_dropt_handle_verbose_bool(context,"01",0,'\x01','\0',0x214);
        bVar40 = test_dropt_handle_verbose_bool(context,"11",6,'\0','\0',0x215);
        bVar41 = test_dropt_handle_verbose_bool(context,"a",6,'\0','\0',0x216);
        bVar42 = test_dropt_handle_verbose_bool(context,"a",6,'\x01','\x01',0x217);
        bVar43 = test_dropt_handle_verbose_bool(context,"true",0,'\x01','\0',0x218);
        bVar44 = test_dropt_handle_verbose_bool(context,"false",0,'\0','\0',0x219);
        bVar45 = test_dropt_handle_int(context,(dropt_char *)0x0,5,0x2a,0x2a,0x21b);
        bVar46 = test_dropt_handle_int(context,"",5,0x2a,0x2a,0x21c);
        bVar47 = test_dropt_handle_int(context," ",6,0x2a,0x2a,0x21d);
        bVar48 = test_dropt_handle_int(context,"0",0,0,0,0x21e);
        bVar49 = test_dropt_handle_int(context,"-0",0,0,0,0x21f);
        bVar50 = test_dropt_handle_int(context,"123",0,0x7b,0,0x220);
        bVar51 = test_dropt_handle_int(context,"0123",0,0x7b,0,0x221);
        bVar52 = test_dropt_handle_int(context,"+123",0,0x7b,0,0x222);
        bVar53 = test_dropt_handle_int(context,"-123",0,-0x7b,0,0x223);
        bVar54 = test_dropt_handle_int(context,"12.3",6,0x2a,0x2a,0x224);
        bVar55 = test_dropt_handle_int(context,"a",6,0x2a,0x2a,0x225);
        bVar56 = test_dropt_handle_int(context,"123a",6,0x2a,0x2a,0x226);
        bVar57 = test_dropt_handle_int(context,"3000000000",7,0x2a,0x2a,0x227);
        bVar58 = test_dropt_handle_int(context,"-3000000000",7,0x2a,0x2a,0x228);
        bVar59 = test_dropt_handle_uint(context,(dropt_char *)0x0,5,0xcafebabe,0xcafebabe,0x22a);
        bVar60 = test_dropt_handle_uint(context,"",5,0xcafebabe,0xcafebabe,0x22b);
        bVar61 = test_dropt_handle_uint(context," ",6,0xcafebabe,0xcafebabe,0x22c);
        bVar62 = test_dropt_handle_uint(context,"0",0,0,0,0x22d);
        bVar63 = test_dropt_handle_uint(context,"-0",6,0xcafebabe,0xcafebabe,0x22e);
        bVar64 = test_dropt_handle_uint(context,"123",0,0x7b,0,0x22f);
        bVar65 = test_dropt_handle_uint(context,"0123",0,0x7b,0,0x230);
        bVar66 = test_dropt_handle_uint(context,"123",0,0x7b,0,0x231);
        bVar67 = test_dropt_handle_uint(context,"+123",0,0x7b,0,0x232);
        bVar68 = test_dropt_handle_uint(context,"-123",6,0xcafebabe,0xcafebabe,0x233);
        bVar69 = test_dropt_handle_uint(context,"12.3",6,0xcafebabe,0xcafebabe,0x234);
        bVar70 = test_dropt_handle_uint(context,"a",6,0xcafebabe,0xcafebabe,0x235);
        bVar71 = test_dropt_handle_uint(context,"123a",6,0xcafebabe,0xcafebabe,0x236);
        bVar72 = test_dropt_handle_uint(context,"3000000000",0,3000000000,0,0x237);
        bVar73 = test_dropt_handle_uint(context,"-3000000000",6,0xcafebabe,0xcafebabe,0x238);
        bVar74 = test_dropt_handle_uint(context,"5000000000",7,0xcafebabe,0xcafebabe,0x239);
        bVar75 = test_dropt_handle_double(context,(dropt_char *)0x0,5,2.71828,2.71828,0x23b);
        bVar76 = test_dropt_handle_double(context,"",5,2.71828,2.71828,0x23c);
        bVar77 = test_dropt_handle_double(context," ",6,2.71828,2.71828,0x23d);
        bVar78 = test_dropt_handle_double(context,"123",0,123.0,0.0,0x23e);
        bVar79 = test_dropt_handle_double(context,"0123",0,123.0,0.0,0x23f);
        bVar80 = test_dropt_handle_double(context,"+123",0,123.0,0.0,0x240);
        bVar81 = test_dropt_handle_double(context,"-123",0,-123.0,0.0,0x241);
        bVar82 = test_dropt_handle_double(context,"12.3",0,12.3,0.0,0x242);
        bVar83 = test_dropt_handle_double(context,".123",0,0.123,0.0,0x243);
        bVar84 = test_dropt_handle_double(context,"123e-1",0,12.3,0.0,0x244);
        bVar85 = test_dropt_handle_double(context,"12.3e-1",0,1.23,0.0,0x245);
        bVar86 = test_dropt_handle_double(context,"a",6,2.71828,2.71828,0x246);
        bVar87 = test_dropt_handle_double(context,"123a",6,2.71828,2.71828,0x247);
        bVar88 = test_dropt_handle_double(context,"1e1024",7,2.71828,2.71828,0x248);
        bVar12 = bVar88 & bVar87 & bVar86 & bVar85 & bVar84 & bVar83 & bVar82 & bVar81 &
                 bVar80 & bVar79 & bVar78 & bVar77 & bVar76 & bVar75 & bVar74 & bVar73 & bVar72 & 
                                                  bVar71 &
                 bVar70 & bVar69 & bVar68 & bVar67 & bVar66 & bVar65 & bVar64 & bVar63 & bVar62 & 
                                                  bVar61 &
                 bVar60 & bVar59 & bVar58 & bVar57 & bVar56 & bVar55 & bVar54 & bVar53 & bVar52 &
                 bVar51 & bVar50 & bVar49 & bVar48 & bVar47 & bVar46 & bVar45 & bVar44 &
                 bVar43 & bVar42 & bVar41 & bVar40 & bVar39 & bVar38 & bVar37 &
                 bVar36 & bVar35 & bVar34 & bVar33 & bVar32 & bVar31 &
                 bVar30 & bVar29 & bVar28 & bVar27 & bVar26 &
                 bVar25 & bVar24 & bVar23 & bVar22 &
                 bVar21 & bVar20 & bVar19 & bVar18 & bVar17 & bVar14 & bVar12;
        helpParams.indent = 0x95aaf790;
        helpParams.description_start_column = 0x4005bf09;
        uVar6 = dropt_handle_double(context,0,"1e-1024",&helpParams);
        if ((((uVar6 != 8) || ((double)helpParams._0_8_ != 2.71828)) ||
            (NAN((double)helpParams._0_8_))) &&
           (((uVar6 != 0 || ((double)helpParams._0_8_ != 0.0)) || (NAN((double)helpParams._0_8_)))))
        {
          bVar12 = false;
          fprintf(_stderr,
                  "FAILED: dropt_handle_double(\"%s\") returned %d and output %g.  Expected (%d, %g) or (%d, %g).\n"
                  ,helpParams._0_8_,0x4005bf0995aaf790,0,"1e-1024",(ulong)uVar6,8,0);
        }
        bVar14 = test_dropt_handle_string(context,(dropt_char *)0x0,5,"qux","qux",0x260);
        bVar17 = test_dropt_handle_string(context,"",0,"",(dropt_char *)0x0,0x261);
        bVar18 = test_dropt_handle_string(context," ",0," ",(dropt_char *)0x0,0x262);
        bVar19 = test_dropt_handle_string(context,"foo",0,"foo",(dropt_char *)0x0,0x263);
        bVar20 = test_dropt_handle_string(context,"foo bar",0,"foo bar",(dropt_char *)0x0,0x264);
        if ((bVar19 & bVar18 & bVar17 & bVar14 & bVar12 & bVar20) == false) {
          bVar95 = 1;
        }
        else {
          dropt_set_error_handler(context,my_dropt_error_handler,0);
          init_option_defaults();
          bVar12 = test_dropt_parse(context);
          bVar95 = 1;
          if (bVar12 != false) {
            init_option_defaults();
            dropt_allow_concatenated_arguments(context,allowConcatenatedArgs);
            plVar93 = (long *)dropt_parse(context,0xffffffffffffffff,argv + 1);
            dVar89 = get_and_print_dropt_error(context);
            if (dVar89 != 0) {
              fputc(10,_stdout);
            }
            if (showHelp == '\0') {
              bVar95 = 0;
              if ((1 < argc) && (bVar95 = 0, quiet == '\0')) {
                pcVar90 = "(null)";
                if (stringVal != (dropt_char *)0x0) {
                  pcVar90 = stringVal;
                }
                fprintf(_stdout,
                        "Compilation flags: %s%s%s\nnormalFlag: %u\nrequiredArgFlag: %u\nhiddenFlag: %u\nstring: %s\nintVal: %d\noptionalUInt: %u, value: %u\nipAddress: %u.%u.%u.%u (%u)\ntristate: %d\n\n"
                        ,"","","",(ulong)normalFlag,(ulong)requiredArgFlag,(ulong)hiddenFlag,pcVar90
                        ,(ulong)(uint)intVal,(ulong)optionalUInt.is_set,(ulong)optionalUInt.value,
                        (ulong)(ipAddress >> 0x18),(ulong)(ipAddress >> 0x10 & 0xff),
                        (ulong)(ipAddress >> 8 & 0xff),(ulong)(ipAddress & 0xff),(ulong)ipAddress,
                        triVal);
                fwrite("Rest:",5,1,_stdout);
                while( true ) {
                  if (*plVar93 == 0) break;
                  fprintf(_stdout," %s");
                  plVar93 = plVar93 + 1;
                }
                fputc(10,_stdout);
                bVar95 = 0;
              }
            }
            else {
              fputs("Usage: test_dropt [options] [--] [operands]\n\n",_stdout);
              dropt_init_help_params(&helpParams);
              helpParams.description_start_column = 0x1e;
              helpParams.blank_lines_between_options = '\0';
              dropt_print_help(_stdout,context,&helpParams);
              bVar95 = 0;
            }
          }
        }
        goto LAB_00104690;
      }
      fputs("Insufficient memory.\n",_stderr);
    }
  }
  bVar95 = 1;
  context = (dropt_context *)0x0;
LAB_00104690:
  dropt_free_context(context);
  if (bVar95 != 0) {
    fputs("One or more tests failed.\n",_stderr);
  }
  return (int)bVar95;
}

Assistant:

int
main(int argc, char** argv)
#endif
{
    dropt_char** rest;
    dropt_context* droptContext = NULL;

    bool success = test_strings();
    if (!success) { goto exit; }

    droptContext = dropt_new_context(options);
    if (droptContext == NULL)
    {
        fputts(T("Insufficient memory.\n"), stderr);
        success = false;
        goto exit;
    }

    success = test_dropt_handlers(droptContext);
    if (!success) { goto exit; }

    dropt_set_error_handler(droptContext, my_dropt_error_handler, NULL);

    init_option_defaults();
    success = test_dropt_parse(droptContext);
    if (!success) { goto exit; }

    init_option_defaults();
    dropt_allow_concatenated_arguments(droptContext, allowConcatenatedArgs);
    rest = dropt_parse(droptContext, -1, &argv[1]);

    /* Most programs normally should abort if given invalid arguments, but
     * for diagnostic purposes, this test program presses on anyway.
     */
    if (get_and_print_dropt_error(droptContext) != dropt_error_none)
    {
        fputtc(T('\n'), stdout);
    }

    if (showHelp)
    {
        fputts(T("Usage: test_dropt [options] [--] [operands]\n\n"), stdout);
#ifndef DROPT_NO_STRING_BUFFERS
        {
            dropt_help_params helpParams;
            dropt_init_help_params(&helpParams);
            helpParams.description_start_column = 30;
            helpParams.blank_lines_between_options = false;
            dropt_print_help(stdout, droptContext, &helpParams);
        }
#endif
        goto exit;
    }

    if (argc > 1 && !quiet)
    {
        dropt_char** arg;

        ftprintf(stdout, T("Compilation flags: %s%s%s\n")
                         T("normalFlag: %u\n")
                         T("requiredArgFlag: %u\n")
                         T("hiddenFlag: %u\n")
                         T("string: %s\n")
                         T("intVal: %d\n")
                         T("optionalUInt: %u, value: %u\n")
                         T("ipAddress: %u.%u.%u.%u (%u)\n")
                         T("tristate: %d\n")
                         T("\n"),
#ifdef NDEBUG
                 T("NDEBUG "),
#else
                 T(""),
#endif
#ifdef DROPT_NO_STRING_BUFFERS
                 T("DROPT_NO_STRING_BUFFERS "),
#else
                 T(""),
#endif
#ifdef DROPT_USE_WCHAR
                 T("DROPT_USE_WCHAR "),
#else
                 T(""),
#endif
                 normalFlag, requiredArgFlag, hiddenFlag,
                 (stringVal == NULL) ? T("(null)") : stringVal,
                 intVal, optionalUInt.is_set, optionalUInt.value,
                 (ipAddress >> 24) & 0xFF,
                 (ipAddress >> 16) & 0xFF,
                 (ipAddress >> 8) & 0xFF,
                 ipAddress & 0xFF,
                 ipAddress,
                 triVal);
        ftprintf(stdout, T("Rest:"));
        for (arg = rest; *arg != NULL; arg++)
        {
            ftprintf(stdout, T(" %s"), *arg);
        }
        fputtc(T('\n'), stdout);
    }

exit:
    dropt_free_context(droptContext);

    if (!success) { fputts(T("One or more tests failed.\n"), stderr); }
    return success ? EXIT_SUCCESS : EXIT_FAILURE;
}